

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArduinoPressureSensor.cpp
# Opt level: O2

void * ArduinoPressureSensorThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  int local_8d0;
  int local_8cc;
  double local_8c8;
  double local_8b8;
  double local_8b0;
  ARDUINOPRESSURESENSORDATA arduinopressuresensordata;
  interval local_880;
  CHRONO chrono_filter;
  interval local_820;
  interval local_808;
  CHRONO chrono_period;
  char szTemp [256];
  ARDUINOPRESSURESENSOR arduinopressuresensor;
  char szSaveFilePath [256];
  
  memset(&arduinopressuresensor,0,0x568);
  StartChrono(&chrono_filter);
  StartChrono(&chrono_period);
  local_8d0 = 0x32;
  local_8c8 = 0.0;
  bVar2 = false;
  local_8cc = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      mSleep((long)local_8d0);
      if (bPauseArduinoPressureSensor == 0) break;
      if (!bVar2) {
        puts("ArduinoPressureSensor paused.");
        DisconnectArduinoPressureSensor(&arduinopressuresensor);
      }
      if (bExit != 0) goto LAB_00182c27;
      mSleep(100);
      bVar2 = true;
    }
    if (bRestartArduinoPressureSensor == 0) {
      if (bVar2) goto LAB_001828ee;
      iVar6 = GetLatestDataArduinoPressureSensor(&arduinopressuresensor,&arduinopressuresensordata);
      if (iVar6 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        pressure_mes = arduinopressuresensordata.Pressure;
        dVar10 = GetTimeElapsedChronoQuick(&chrono_filter);
        if ((2.0 < dVar10) && (dVar10 = GetTimeElapsedChronoQuick(&chrono_filter), dVar10 <= 3.0)) {
          local_8c8 = arduinopressuresensordata.Pressure;
        }
        dVar11 = GetTimeElapsedChronoQuick(&chrono_filter);
        dVar10 = arduinopressuresensordata.Pressure;
        if (3.0 < dVar11) {
          uVar9 = -(ulong)(ABS(arduinopressuresensordata.Pressure - local_8c8) < 0.05);
          dVar10 = (double)((ulong)arduinopressuresensordata.Pressure & uVar9 |
                           ~uVar9 & (ulong)local_8c8);
          local_8c8 = dVar10;
        }
        local_8b0 = ((dVar10 - arduinopressuresensor.PressureRef) * -100000.0) /
                    (arduinopressuresensor.WaterDensity * 9.80665);
        interval::interval(&local_880,&local_8b0);
        local_8b8 = -z_pressure_acc;
        interval::interval(&local_820,&local_8b8,&z_pressure_acc);
        operator+(&local_880,&local_820);
        interval::operator=((interval *)&z_pressure,&local_808);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_00182c0a;
      }
      puts("Connection to an ArduinoPressureSensor lost.");
      DisconnectArduinoPressureSensor(&arduinopressuresensor);
LAB_0018290b:
      local_8cc = local_8cc + 1;
      if (ExitOnErrorCount <= local_8cc && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_00182c27:
        bVar3 = true;
        goto LAB_00182c2a;
      }
      bVar2 = false;
      bVar3 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting an ArduinoPressureSensor.");
        DisconnectArduinoPressureSensor(&arduinopressuresensor);
      }
      bRestartArduinoPressureSensor = 0;
LAB_001828ee:
      iVar5 = ConnectArduinoPressureSensor(&arduinopressuresensor,"ArduinoPressureSensor0.txt");
      iVar6 = arduinopressuresensor.threadperiod;
      if (iVar5 != 0) {
        mSleep(1000);
        goto LAB_0018290b;
      }
      local_8d0 = arduinopressuresensor.threadperiod;
      arduinopressuresensordata.pressure = 0.0;
      arduinopressuresensordata.temperature = 0.0;
      arduinopressuresensordata.depth = 0.0;
      arduinopressuresensordata.altitude = 0.0;
      arduinopressuresensordata.Pressure = 0.0;
      StopChronoQuick(&chrono_filter);
      StartChrono(&chrono_filter);
      if (arduinopressuresensor.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)arduinopressuresensor.pfSaveFile);
        arduinopressuresensor.pfSaveFile = (FILE *)0x0;
      }
      if (arduinopressuresensor.bSaveRawData == 0) {
LAB_00182c0a:
        bVar3 = false;
        bVar2 = true;
      }
      else {
        if (arduinopressuresensor.szCfgFilePath[0] == '\0') {
          builtin_strncpy(szTemp,"arduinopressuresensor",0x16);
        }
        else {
          sprintf(szTemp,"%.127s",arduinopressuresensor.szCfgFilePath);
        }
        sVar7 = strlen(szTemp);
        iVar5 = (int)sVar7 + 1;
        uVar9 = sVar7 & 0xffffffff;
        do {
          if ((int)uVar9 < 1) goto LAB_00182a61;
          uVar1 = uVar9 - 1;
          iVar5 = iVar5 + -1;
          lVar4 = uVar9 - 1;
          uVar9 = uVar1;
        } while (szTemp[lVar4] != '.');
        if ((uVar1 != 0) && (iVar5 <= (int)sVar7)) {
          memset(szTemp + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
        }
LAB_00182a61:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar8 = strtimeex_fns();
        bVar3 = false;
        sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar8);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        arduinopressuresensor.pfSaveFile = (FILE *)fopen(szSaveFilePath,"w");
        bVar2 = true;
        local_8d0 = iVar6;
        if ((FILE *)arduinopressuresensor.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create ArduinoPressureSensor data file.");
          bVar3 = false;
          goto LAB_00182c2a;
        }
      }
    }
    if (bExit != 0) {
LAB_00182c2a:
      StopChronoQuick(&chrono_period);
      StopChronoQuick(&chrono_filter);
      if (arduinopressuresensor.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)arduinopressuresensor.pfSaveFile);
        arduinopressuresensor.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        DisconnectArduinoPressureSensor(&arduinopressuresensor);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE ArduinoPressureSensorThread(void* pParam)
{
	ARDUINOPRESSURESENSOR arduinopressuresensor;
	ARDUINOPRESSURESENSORDATA arduinopressuresensordata;
	double pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&arduinopressuresensor, 0, sizeof(ARDUINOPRESSURESENSOR));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseArduinoPressureSensor) 
		{ 
			if (bConnected)
			{
				printf("ArduinoPressureSensor paused.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartArduinoPressureSensor) 
		{ 
			if (bConnected)
			{
				printf("Restarting an ArduinoPressureSensor.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
			bRestartArduinoPressureSensor = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectArduinoPressureSensor(&arduinopressuresensor, "ArduinoPressureSensor0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = arduinopressuresensor.threadperiod;

				memset(&arduinopressuresensordata, 0, sizeof(arduinopressuresensordata));
				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (arduinopressuresensor.pfSaveFile != NULL)
				{
					fclose(arduinopressuresensor.pfSaveFile); 
					arduinopressuresensor.pfSaveFile = NULL;
				}
				if ((arduinopressuresensor.bSaveRawData)&&(arduinopressuresensor.pfSaveFile == NULL)) 
				{
					if (strlen(arduinopressuresensor.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", arduinopressuresensor.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "arduinopressuresensor");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					arduinopressuresensor.pfSaveFile = fopen(szSaveFilePath, "w");
					if (arduinopressuresensor.pfSaveFile == NULL) 
					{
						printf("Unable to create ArduinoPressureSensor data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataArduinoPressureSensor(&arduinopressuresensor, &arduinopressuresensordata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = arduinopressuresensordata.Pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = arduinopressuresensordata.Pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(arduinopressuresensordata.Pressure-pressure_prev) < 0.05)
					{
						filteredpressure = arduinopressuresensordata.Pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = arduinopressuresensordata.Pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, arduinopressuresensor.PressureRef, arduinopressuresensor.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to an ArduinoPressureSensor lost.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
		}

		//printf("ArduinoPressureSensorThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (arduinopressuresensor.pfSaveFile != NULL)
	{
		fclose(arduinopressuresensor.pfSaveFile); 
		arduinopressuresensor.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectArduinoPressureSensor(&arduinopressuresensor);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}